

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void master_selection(j_decompress_ptr cinfo)

{
  jpeg_decomp_master *pjVar1;
  boolean bVar2;
  ulong uVar3;
  int iVar4;
  bool local_31;
  int local_30;
  int nscans;
  JDIMENSION jd_samplesperrow;
  long samplesperrow;
  boolean use_c_buffer;
  my_master_ptr master;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->master;
  jpeg_calc_output_dimensions(cinfo);
  prepare_range_limit_table(cinfo);
  uVar3 = (ulong)cinfo->output_width * (long)cinfo->out_color_components;
  if ((uVar3 & 0xffffffff) != uVar3) {
    cinfo->err->msg_code = 0x48;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  *(undefined4 *)&pjVar1[1].prepare_for_output_pass = 0;
  bVar2 = use_merged_upsample(cinfo);
  *(boolean *)((long)&pjVar1[1].prepare_for_output_pass + 4) = bVar2;
  pjVar1[1].finish_output_pass = (_func_void_j_decompress_ptr *)0x0;
  *(undefined8 *)&pjVar1[1].is_dummy_pass = 0;
  if ((cinfo->quantize_colors == 0) || (cinfo->buffered_image == 0)) {
    cinfo->enable_1pass_quant = 0;
    cinfo->enable_external_quant = 0;
    cinfo->enable_2pass_quant = 0;
  }
  if (cinfo->quantize_colors != 0) {
    if (cinfo->raw_data_out != 0) {
      cinfo->err->msg_code = 0x30;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->out_color_components == 3) {
      if (cinfo->colormap == (JSAMPARRAY)0x0) {
        if (cinfo->two_pass_quantize == 0) {
          cinfo->enable_1pass_quant = 1;
        }
        else {
          cinfo->enable_2pass_quant = 1;
        }
      }
      else {
        cinfo->enable_external_quant = 1;
      }
    }
    else {
      cinfo->enable_1pass_quant = 1;
      cinfo->enable_external_quant = 0;
      cinfo->enable_2pass_quant = 0;
      cinfo->colormap = (JSAMPARRAY)0x0;
    }
    if (cinfo->enable_1pass_quant != 0) {
      jinit_1pass_quantizer(cinfo);
      pjVar1[1].finish_output_pass = (_func_void_j_decompress_ptr *)cinfo->cquantize;
    }
    if ((cinfo->enable_2pass_quant != 0) || (cinfo->enable_external_quant != 0)) {
      jinit_2pass_quantizer(cinfo);
      *(jpeg_color_quantizer **)&pjVar1[1].is_dummy_pass = cinfo->cquantize;
    }
  }
  if (cinfo->raw_data_out == 0) {
    if (*(int *)((long)&pjVar1[1].prepare_for_output_pass + 4) == 0) {
      jinit_color_deconverter(cinfo);
      jinit_upsampler(cinfo);
    }
    else {
      jinit_merged_upsampler(cinfo);
    }
    jinit_d_post_controller(cinfo,cinfo->enable_2pass_quant);
  }
  jinit_inverse_dct(cinfo);
  if (cinfo->arith_code == 0) {
    jinit_huff_decoder(cinfo);
  }
  else {
    jinit_arith_decoder(cinfo);
  }
  local_31 = true;
  if (cinfo->inputctl->has_multiple_scans == 0) {
    local_31 = cinfo->buffered_image != 0;
  }
  jinit_d_coef_controller(cinfo,(uint)local_31);
  if (cinfo->raw_data_out == 0) {
    jinit_d_main_controller(cinfo,0);
  }
  (*cinfo->mem->realize_virt_arrays)((j_common_ptr)cinfo);
  (*cinfo->inputctl->start_input_pass)(cinfo);
  if (((cinfo->progress != (jpeg_progress_mgr *)0x0) && (cinfo->buffered_image == 0)) &&
     (cinfo->inputctl->has_multiple_scans != 0)) {
    if (cinfo->progressive_mode == 0) {
      local_30 = cinfo->num_components;
    }
    else {
      local_30 = cinfo->num_components * 3 + 2;
    }
    cinfo->progress->pass_counter = 0;
    cinfo->progress->pass_limit = (ulong)cinfo->total_iMCU_rows * (long)local_30;
    cinfo->progress->completed_passes = 0;
    iVar4 = 2;
    if (cinfo->enable_2pass_quant != 0) {
      iVar4 = 3;
    }
    cinfo->progress->total_passes = iVar4;
    *(int *)&pjVar1[1].prepare_for_output_pass = *(int *)&pjVar1[1].prepare_for_output_pass + 1;
  }
  return;
}

Assistant:

LOCAL(void)
master_selection (j_decompress_ptr cinfo)
{
  my_master_ptr master = (my_master_ptr) cinfo->master;
  boolean use_c_buffer;
  long samplesperrow;
  JDIMENSION jd_samplesperrow;

  /* Initialize dimensions and other stuff */
  jpeg_calc_output_dimensions(cinfo);
  prepare_range_limit_table(cinfo);

  /* Width of an output scanline must be representable as JDIMENSION. */
  samplesperrow = (long) cinfo->output_width * (long) cinfo->out_color_components;
  jd_samplesperrow = (JDIMENSION) samplesperrow;
  if ((long) jd_samplesperrow != samplesperrow)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);

  /* Initialize my private state */
  master->pass_number = 0;
  master->using_merged_upsample = use_merged_upsample(cinfo);

  /* Color quantizer selection */
  master->quantizer_1pass = NULL;
  master->quantizer_2pass = NULL;
  /* No mode changes if not using buffered-image mode. */
  if (! cinfo->quantize_colors || ! cinfo->buffered_image) {
    cinfo->enable_1pass_quant = FALSE;
    cinfo->enable_external_quant = FALSE;
    cinfo->enable_2pass_quant = FALSE;
  }
  if (cinfo->quantize_colors) {
    if (cinfo->raw_data_out)
      ERREXIT(cinfo, JERR_NOTIMPL);
    /* 2-pass quantizer only works in 3-component color space. */
    if (cinfo->out_color_components != 3) {
      cinfo->enable_1pass_quant = TRUE;
      cinfo->enable_external_quant = FALSE;
      cinfo->enable_2pass_quant = FALSE;
      cinfo->colormap = NULL;
    } else if (cinfo->colormap != NULL) {
      cinfo->enable_external_quant = TRUE;
    } else if (cinfo->two_pass_quantize) {
      cinfo->enable_2pass_quant = TRUE;
    } else {
      cinfo->enable_1pass_quant = TRUE;
    }

    if (cinfo->enable_1pass_quant) {
#ifdef QUANT_1PASS_SUPPORTED
      jinit_1pass_quantizer(cinfo);
      master->quantizer_1pass = cinfo->cquantize;
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
    }

    /* We use the 2-pass code to map to external colormaps. */
    if (cinfo->enable_2pass_quant || cinfo->enable_external_quant) {
#ifdef QUANT_2PASS_SUPPORTED
      jinit_2pass_quantizer(cinfo);
      master->quantizer_2pass = cinfo->cquantize;
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
    }
    /* If both quantizers are initialized, the 2-pass one is left active;
     * this is necessary for starting with quantization to an external map.
     */
  }

  /* Post-processing: in particular, color conversion first */
  if (! cinfo->raw_data_out) {
    if (master->using_merged_upsample) {
#ifdef UPSAMPLE_MERGING_SUPPORTED
      jinit_merged_upsampler(cinfo); /* does color conversion too */
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
    } else {
      jinit_color_deconverter(cinfo);
      jinit_upsampler(cinfo);
    }
    jinit_d_post_controller(cinfo, cinfo->enable_2pass_quant);
  }
  /* Inverse DCT */
  jinit_inverse_dct(cinfo);
  /* Entropy decoding: either Huffman or arithmetic coding. */
  if (cinfo->arith_code)
    jinit_arith_decoder(cinfo);
  else {
    jinit_huff_decoder(cinfo);
  }

  /* Initialize principal buffer controllers. */
  use_c_buffer = cinfo->inputctl->has_multiple_scans || cinfo->buffered_image;
  jinit_d_coef_controller(cinfo, use_c_buffer);

  if (! cinfo->raw_data_out)
    jinit_d_main_controller(cinfo, FALSE /* never need full buffer here */);

  /* We can now tell the memory manager to allocate virtual arrays. */
  (*cinfo->mem->realize_virt_arrays) ((j_common_ptr) cinfo);

  /* Initialize input side of decompressor to consume first scan. */
  (*cinfo->inputctl->start_input_pass) (cinfo);

#ifdef D_MULTISCAN_FILES_SUPPORTED
  /* If jpeg_start_decompress will read the whole file, initialize
   * progress monitoring appropriately.  The input step is counted
   * as one pass.
   */
  if (cinfo->progress != NULL && ! cinfo->buffered_image &&
      cinfo->inputctl->has_multiple_scans) {
    int nscans;
    /* Estimate number of scans to set pass_limit. */
    if (cinfo->progressive_mode) {
      /* Arbitrarily estimate 2 interleaved DC scans + 3 AC scans/component. */
      nscans = 2 + 3 * cinfo->num_components;
    } else {
      /* For a nonprogressive multiscan file, estimate 1 scan per component. */
      nscans = cinfo->num_components;
    }
    cinfo->progress->pass_counter = 0L;
    cinfo->progress->pass_limit = (long) cinfo->total_iMCU_rows * nscans;
    cinfo->progress->completed_passes = 0;
    cinfo->progress->total_passes = (cinfo->enable_2pass_quant ? 3 : 2);
    /* Count the input pass as done */
    master->pass_number++;
  }
#endif /* D_MULTISCAN_FILES_SUPPORTED */
}